

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

int struct_size_field_list(FMFieldList list,int pointer_size)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  long elements;
  int field_size;
  int struct_size;
  int i;
  uint local_24;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int iVar2;
  int local_10;
  
  local_10 = 0;
  local_24 = 0;
  while( true ) {
    if (*(long *)(in_RDI + (long)local_10 * 0x18) == 0) {
      return local_24;
    }
    iVar1 = is_var_array_field((FMFieldList)((ulong)local_24 << 0x20),in_stack_ffffffffffffffe4);
    iVar2 = in_ESI;
    if (iVar1 != 1) {
      FMarray_str_to_data_type(*(undefined8 *)(in_RDI + (long)local_10 * 0x18 + 8),&local_20);
      iVar2 = *(int *)(in_RDI + (long)local_10 * 0x18 + 0x10) * local_20;
    }
    if (iVar2 < 1) break;
    if ((int)local_24 < *(int *)(in_RDI + (long)local_10 * 0x18 + 0x14) + iVar2) {
      local_24 = *(int *)(in_RDI + (long)local_10 * 0x18 + 0x14) + iVar2;
    }
    local_10 = local_10 + 1;
  }
  __assert_fail("field_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_compat.c"
                ,0x48,"int struct_size_field_list(FMFieldList, int)");
}

Assistant:

static
int
struct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is ioformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}